

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall printing_callbacks::on_boolean(printing_callbacks *this,bool value)

{
  ostream *poVar1;
  bool value_local;
  printing_callbacks *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"bool: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::boolalpha);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,value);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void on_boolean(bool value)
    {
        std::cout << "bool: " << std::boolalpha << value << std::endl;
    }